

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

bool caffe::FillerParameter_VarianceNorm_IsValid(int value)

{
  int value_local;
  
  return (uint)value < 3;
}

Assistant:

bool FillerParameter_VarianceNorm_IsValid(int value) {
  switch (value) {
    case 0:
    case 1:
    case 2:
      return true;
    default:
      return false;
  }
}